

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_read_uint32_array
              (coda_cursor_conflict *cursor,uint32_t *dst,coda_array_ordering array_ordering)

{
  int iVar1;
  coda_type *local_38;
  coda_type_array *type;
  coda_array_ordering array_ordering_local;
  uint32_t *dst_local;
  coda_cursor_conflict *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_38 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_38 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if ((*(coda_type **)(local_38 + 1))->format == coda_format_binary) {
    cursor_local._4_4_ =
         read_array(cursor,coda_bin_cursor_read_uint32,(uint8_t *)dst,4,array_ordering);
  }
  else {
    if ((*(coda_type **)(local_38 + 1))->format != coda_format_ascii) {
      __assert_fail("type->base_type->format == coda_format_ascii",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-bin-cursor.c"
                    ,0x40c,
                    "int coda_bin_cursor_read_uint32_array(const coda_cursor *, uint32_t *, coda_array_ordering)"
                   );
    }
    iVar1 = read_array(cursor,coda_ascii_cursor_read_uint32,(uint8_t *)dst,4,coda_array_ordering_c);
    if (iVar1 == 0) {
      if ((array_ordering == coda_array_ordering_c) ||
         (iVar1 = transpose_array(cursor,dst,4), iVar1 == 0)) {
        cursor_local._4_4_ = 0;
      }
      else {
        cursor_local._4_4_ = -1;
      }
    }
    else {
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_bin_cursor_read_uint32_array(const coda_cursor *cursor, uint32_t *dst, coda_array_ordering array_ordering)
{
    coda_type_array *type = (coda_type_array *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

    if (type->base_type->format == coda_format_binary)
    {
        return read_array(cursor, (read_function)&coda_bin_cursor_read_uint32, (uint8_t *)dst, sizeof(uint32_t),
                          array_ordering);
    }
    assert(type->base_type->format == coda_format_ascii);
    if (read_array(cursor, (read_function)&coda_ascii_cursor_read_uint32, (uint8_t *)dst, sizeof(uint32_t),
                   coda_array_ordering_c) != 0)
    {
        return -1;
    }
    if (array_ordering != coda_array_ordering_c)
    {
        if (transpose_array(cursor, dst, sizeof(uint32_t)) != 0)
        {
            return -1;
        }
    }

    return 0;
}